

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O3

int mbedtls_base64_self_test(int verbose)

{
  int iVar1;
  char *__s;
  size_t len;
  uchar buffer [128];
  size_t local_a0;
  uchar local_98 [136];
  
  if (verbose != 0) {
    printf("  Base64 encoding test: ");
  }
  iVar1 = mbedtls_base64_encode(local_98,0x80,&local_a0,base64_test_dec,0x40);
  if ((iVar1 == 0) &&
     (iVar1 = bcmp("JEhuVodiWr2/F9mixBcaAZTtjx4Rs9cJDLbpEG8i7hPKswcFdsn6MWwINP+Nwmw4AEPpVJevUEvRQbqVMVoLlw=="
                   ,local_98,0x58), iVar1 == 0)) {
    if (verbose != 0) {
      printf("passed\n  Base64 decoding test: ");
    }
    iVar1 = mbedtls_base64_decode
                      (local_98,0x80,&local_a0,
                       "JEhuVodiWr2/F9mixBcaAZTtjx4Rs9cJDLbpEG8i7hPKswcFdsn6MWwINP+Nwmw4AEPpVJevUEvRQbqVMVoLlw=="
                       ,0x58);
    if ((iVar1 == 0) && (iVar1 = bcmp(base64_test_dec,local_98,0x40), iVar1 == 0)) {
      iVar1 = 0;
      if (verbose == 0) {
        return 0;
      }
      __s = "passed\n";
      goto LAB_00141068;
    }
  }
  iVar1 = 1;
  if (verbose == 0) {
    return 1;
  }
  __s = "failed";
LAB_00141068:
  puts(__s);
  return iVar1;
}

Assistant:

int mbedtls_base64_self_test( int verbose )
{
    size_t len;
    const unsigned char *src;
    unsigned char buffer[128];

    if( verbose != 0 )
        mbedtls_printf( "  Base64 encoding test: " );

    src = base64_test_dec;

    if( mbedtls_base64_encode( buffer, sizeof( buffer ), &len, src, 64 ) != 0 ||
         memcmp( base64_test_enc, buffer, 88 ) != 0 )
    {
        if( verbose != 0 )
            mbedtls_printf( "failed\n" );

        return( 1 );
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n  Base64 decoding test: " );

    src = base64_test_enc;

    if( mbedtls_base64_decode( buffer, sizeof( buffer ), &len, src, 88 ) != 0 ||
         memcmp( base64_test_dec, buffer, 64 ) != 0 )
    {
        if( verbose != 0 )
            mbedtls_printf( "failed\n" );

        return( 1 );
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n\n" );

    return( 0 );
}